

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O2

void make_edge_list(uint **edge_list,uint *edge_list_size,char *edges,RDL_graph *graph,RDL_cfam *rcf
                   ,RDL_sPathInfo *spi)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  memset(edges,0,(ulong)graph->E);
  RDL_findEdges(edges,rcf,graph,spi);
  puVar1 = (uint *)malloc(0x100);
  *edge_list = puVar1;
  uVar3 = 0x40;
  for (uVar4 = 0; uVar4 < graph->E; uVar4 = uVar4 + 1) {
    if (edges[uVar4] != '\0') {
      uVar2 = *edge_list_size;
      if (uVar2 == (uint)uVar3) {
        uVar3 = (ulong)((uint)uVar3 * 2);
        puVar1 = (uint *)realloc(puVar1,uVar3 * 4);
        *edge_list = puVar1;
        uVar2 = *edge_list_size;
      }
      puVar1[uVar2] = (uint)uVar4;
      *edge_list_size = *edge_list_size + 1;
    }
  }
  puVar1 = (uint *)realloc(puVar1,(ulong)*edge_list_size << 2);
  *edge_list = puVar1;
  return;
}

Assistant:

static void make_edge_list(
    unsigned** edge_list,
    unsigned* edge_list_size,
    char* edges, RDL_graph *graph,
    RDL_cfam* rcf, RDL_sPathInfo* spi)
{
  unsigned alloced, i;

  memset(edges, 0, graph->E * sizeof(*edges));
  RDL_findEdges(edges, rcf, graph, spi);

  alloced = 64;
  *edge_list = malloc(alloced * sizeof(**edge_list));

  for (i = 0; i < graph->E; ++i) {
    if (edges[i]) {
      if (*edge_list_size == alloced) {
        alloced *= 2;
        *edge_list = realloc(*edge_list, alloced * sizeof(**edge_list));
      }
      (*edge_list)[*edge_list_size] = i;
      ++(*edge_list_size);
    }
  }
  *edge_list = realloc(*edge_list, *edge_list_size * sizeof(**edge_list));
}